

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getAutoVacuum(char *z)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  int x;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    if (bVar1 == "unix-none"[lVar3 + 5]) {
      if ((ulong)bVar1 == 0) goto LAB_001ab4d3;
    }
    else if (""[bVar1] != ""[(byte)"unix-none"[lVar3 + 5]]) {
      lVar3 = 0;
      break;
    }
    lVar3 = lVar3 + 1;
  } while( true );
LAB_001ab4e3:
  bVar1 = z[lVar3];
  if (bVar1 == "database or disk is full"[lVar3 + 0x14]) {
    if ((ulong)bVar1 == 0) goto LAB_001ab507;
  }
  else if (""[bVar1] != ""[(byte)"database or disk is full"[lVar3 + 0x14]]) {
    lVar3 = 0;
    goto LAB_001ab517;
  }
  lVar3 = lVar3 + 1;
  goto LAB_001ab4e3;
LAB_001ab517:
  bVar1 = z[lVar3];
  if (bVar1 == "incremental"[lVar3]) {
    if ((ulong)bVar1 == 0) goto LAB_001ab53b;
  }
  else if (""[bVar1] != ""[(byte)"incremental"[lVar3]]) {
    local_1c = 0;
    sqlite3GetInt32(z,(int *)&local_1c);
    uVar2 = local_1c & 0xff;
    if (2 < local_1c) {
      uVar2 = 0;
    }
    goto LAB_001ab55e;
  }
  lVar3 = lVar3 + 1;
  goto LAB_001ab517;
LAB_001ab53b:
  uVar2 = 2;
  goto LAB_001ab55e;
LAB_001ab507:
  uVar2 = 1;
  goto LAB_001ab55e;
LAB_001ab4d3:
  uVar2 = 0;
LAB_001ab55e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}